

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

int perfetto::base::anon_unknown_0::GetSockFamily(SockFamily family)

{
  uint uVar1;
  code *pcVar2;
  char *fname;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  int local_c;
  SockFamily family_local;
  
  if (family == kUnix) {
    local_c = 1;
  }
  else if (family == kInet) {
    local_c = 2;
  }
  else {
    if (family != kInet6) {
      fname = Basename(
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      LogMessage(kLogError,fname,0x106b0,"%s (errno: %d, %s)","PERFETTO_CHECK(false)",(ulong)uVar1,
                 pcVar5);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_c = 10;
  }
  return local_c;
}

Assistant:

inline int GetSockFamily(SockFamily family) {
  switch (family) {
    case SockFamily::kUnix:
      return AF_UNIX;
    case SockFamily::kInet:
      return AF_INET;
    case SockFamily::kInet6:
      return AF_INET6;
  }
  PERFETTO_CHECK(false);  // For GCC.
}